

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O0

Collator * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::get_collator
          (collate_impl<wchar_t> *this,level_type ilevel)

{
  UBool UVar1;
  char *__rhs;
  Collator *pCVar2;
  level_type in_ESI;
  collate_impl<wchar_t> *in_RDI;
  UErrorCode status;
  Collator *col;
  int l;
  Collator *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *this_00;
  undefined1 local_69 [69];
  UErrorCode local_24;
  Collator *local_20;
  level_type local_18;
  Collator *local_8;
  
  local_18 = limit(in_RDI,in_ESI);
  local_20 = thread_specific_ptr<icu_70::Collator>::get
                       ((thread_specific_ptr<icu_70::Collator> *)0x2629e6);
  local_8 = local_20;
  if (local_20 == (Collator *)0x0) {
    local_24 = U_ZERO_ERROR;
    this_00 = (runtime_error *)(in_RDI->collates_ + (int)local_18);
    icu_70::Collator::createInstance(&in_RDI->locale_,&local_24);
    thread_specific_ptr<icu_70::Collator>::reset
              ((thread_specific_ptr<icu_70::Collator> *)this_00,in_stack_ffffffffffffff68);
    UVar1 = U_FAILURE(local_24);
    if (UVar1 != '\0') {
      __rhs = (char *)__cxa_allocate_exception(0x30);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_69 + 1),"Creation of collate failed:",(allocator *)__lhs);
      u_errorName_70(local_24);
      std::operator+(__lhs,__rhs);
      runtime_error::runtime_error(this_00,__lhs);
      __cxa_throw(__rhs,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pCVar2 = thread_specific_ptr<icu_70::Collator>::operator->
                       ((thread_specific_ptr<icu_70::Collator> *)0x262b83);
    (**(code **)(*(long *)pCVar2 + 0x98))(pCVar2,get_collator::levels[(int)local_18]);
    local_8 = thread_specific_ptr<icu_70::Collator>::get
                        ((thread_specific_ptr<icu_70::Collator> *)0x262bc1);
  }
  return local_8;
}

Assistant:

icu::Collator *get_collator(level_type ilevel) const
                {
                    int l = limit(ilevel);
                    static const icu::Collator::ECollationStrength levels[level_count] = 
                    { 
                        icu::Collator::PRIMARY,
                        icu::Collator::SECONDARY,
                        icu::Collator::TERTIARY,
                        icu::Collator::QUATERNARY,
                        icu::Collator::IDENTICAL
                    };
                    
                    icu::Collator *col = collates_[l].get();
                    if(col)
                        return col;

                    UErrorCode status=U_ZERO_ERROR;

                    collates_[l].reset(icu::Collator::createInstance(locale_,status));

                    if(U_FAILURE(status))
                        throw booster::runtime_error(std::string("Creation of collate failed:") + u_errorName(status));

                    collates_[l]->setStrength(levels[l]);
                    return collates_[l].get();
                }